

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetFunctionContextTypeName(ExpressionContext *ctx,InplaceStr functionName,uint index)

{
  ExpressionContext *__src;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  char *pos;
  char *name;
  uint nameLength;
  undefined1 local_48 [8];
  InplaceStr operatorName;
  uint index_local;
  ExpressionContext *ctx_local;
  InplaceStr functionName_local;
  char *__s;
  
  functionName_local.begin = functionName.end;
  ctx_local = (ExpressionContext *)functionName.begin;
  operatorName.end._4_4_ = index;
  if (((((char)ctx_local->optimizationLevel < 'A') && ((char)ctx_local->optimizationLevel != '$'))
      || ((char)ctx_local->optimizationLevel == '|')) ||
     (((char)ctx_local->optimizationLevel == '^' || ((char)ctx_local->optimizationLevel == '~')))) {
    _local_48 = GetOperatorName(functionName);
    bVar1 = InplaceStr::empty((InplaceStr *)local_48);
    if (!bVar1) {
      ctx_local = (ExpressionContext *)local_48;
      functionName_local.begin = operatorName.begin;
    }
  }
  uVar2 = InplaceStr::length((InplaceStr *)&ctx_local);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar2 + 0x21));
  __src = ctx_local;
  __s = (char *)CONCAT44(extraout_var,iVar3);
  *__s = '_';
  pcVar6 = __s + 2;
  __s[1] = '_';
  uVar4 = InplaceStr::length((InplaceStr *)&ctx_local);
  memcpy(pcVar6,__src,(ulong)uVar4);
  uVar4 = InplaceStr::length((InplaceStr *)&ctx_local);
  pcVar6[uVar4] = '_';
  pcVar6 = NameWriteUnsigned(pcVar6 + uVar4 + 1,operatorName.end._4_4_);
  strcpy(pcVar6,"_cls");
  pcVar6[4] = '\0';
  sVar5 = strlen(__s);
  if (uVar2 + 0x21 <= sVar5) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x18e,
                  "InplaceStr GetFunctionContextTypeName(ExpressionContext &, InplaceStr, unsigned int)"
                 );
  }
  InplaceStr::InplaceStr((InplaceStr *)&functionName_local.end,__s);
  return stack0xffffffffffffffe8;
}

Assistant:

InplaceStr GetFunctionContextTypeName(ExpressionContext &ctx, InplaceStr functionName, unsigned index)
{
	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '_';
	*pos++ = '_';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_cls");
	pos += strlen("_cls");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}